

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_div_aarch64(float32 a,float32 b,float_status *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  union_float32 ub;
  ulong uVar4;
  union_float32 ua;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  FloatParts p;
  FloatParts b_00;
  
  uVar8 = (ulong)a;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((a & 0x7fffffff) != 0 && (a & 0x7f800000) == 0) {
        uVar8 = (ulong)(a & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((b & 0x7fffffff) != 0 && (b & 0x7f800000) == 0) {
        b = b & 0x80000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    if ((((uVar8 & 0x7fffffff) == 0) || (((int)(uVar8 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((b >> 0x17) + 1 & 0xfe) != 0)) {
      fVar11 = (float)uVar8 / (float)b;
      if (ABS(fVar11) == INFINITY) {
        s->float_exception_flags = s->float_exception_flags | 8;
        return (float32)fVar11;
      }
      if ((1.1754944e-38 < ABS(fVar11)) || ((uVar8 & 0x7fffffff) == 0)) {
        return (float32)fVar11;
      }
    }
  }
  FVar12._8_8_ = (ulong)((uint)(uVar8 >> 0x17) & 0xff) | (ulong)((uint)uVar8 & 0x80000000) << 9;
  FVar12.frac = (ulong)((uint)uVar8 & 0x7fffff);
  FVar12 = sf_canonicalize(FVar12,&float32_params,s);
  uVar9 = FVar12._8_8_;
  uVar8 = FVar12.frac;
  FVar13._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar13.frac = (ulong)(b & 0x7fffff);
  FVar13 = sf_canonicalize(FVar13,&float32_params,s);
  uVar4 = FVar13._8_8_;
  uVar10 = FVar13.frac;
  uVar7 = (uVar4 ^ uVar9) & 0x10000000000;
  uVar5 = FVar12._12_4_ & 0xff;
  uVar3 = FVar13._12_4_ & 0xff;
  if ((uVar5 == 2) && (uVar3 == 2)) {
    uVar4 = (ulong)((FVar12.exp - FVar13.exp) - (uint)(uVar8 < uVar10));
    lVar6 = 0;
    if (uVar10 <= uVar8) {
      lVar6 = uVar8 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10 * 2;
    auVar2._8_8_ = uVar8 >> (uVar10 <= uVar8);
    auVar2._0_8_ = lVar6;
    uVar8 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar9 = uVar9 & 0xffff00ff00000000;
  }
  else {
    if (((uVar9 | uVar4) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar4 & 0xffffffffffff;
      b_00.frac = uVar10;
      p = pick_nan(FVar12,b_00,s);
      goto LAB_005e6424;
    }
    if (((uVar9 >> 0x20 & 1) != 0) && (uVar5 == uVar3)) {
      s->float_exception_flags = s->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_005e6424;
    }
    if ((uVar9 >> 0x20 & 1) != 0) {
      uVar7 = uVar7 | uVar9 & 0xffff0003ffffffff;
      p.exp = (int)uVar7;
      p.cls = (char)(uVar7 >> 0x20);
      p.sign = (_Bool)(char)(uVar7 >> 0x28);
      p._14_2_ = (short)(uVar7 >> 0x30);
      p.frac = uVar8;
      goto LAB_005e6424;
    }
    if (uVar3 == 3) {
      uVar10 = uVar9 & 0xffff0000ffffffff | uVar7 | 0x100000000;
      p.exp = (int)uVar10;
      p.cls = (char)(uVar10 >> 0x20);
      p.sign = (_Bool)(char)(uVar10 >> 0x28);
      p._14_2_ = (short)(uVar10 >> 0x30);
      p.frac = uVar8;
      goto LAB_005e6424;
    }
    if (uVar3 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    s->float_exception_flags = s->float_exception_flags | 4;
    uVar9 = uVar9 & 0xffff0000ffffffff;
    uVar4 = 0x300000000;
  }
  uVar7 = uVar4 | uVar9 | uVar7;
  p.exp = (int)uVar7;
  p.cls = (char)(uVar7 >> 0x20);
  p.sign = (_Bool)(char)(uVar7 >> 0x28);
  p._14_2_ = (short)(uVar7 >> 0x30);
  p.frac = uVar8;
LAB_005e6424:
  FVar12 = round_canonical(p,s,&float32_params);
  return (uint)FVar12.frac & 0x7fffff | (FVar12.exp & 0xffU) << 0x17 |
         (uint)(FVar12._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}